

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O3

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *e,rt_expression_interface<double> *repl)

{
  rt_expression_interface<double> *prVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  rt_expression_interface<double> *prVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])();
  if ((char)iVar2 != '\0') {
    iVar2 = (*repl->_vptr_rt_expression_interface[2])(repl);
    return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
  }
  prVar5 = (rt_expression_interface<double> *)operator_new(0x20);
  prVar1 = (this->lhs_)._M_ptr;
  iVar2 = (*prVar1->_vptr_rt_expression_interface[0xe])(prVar1,e,repl);
  iVar3 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  prVar1 = (this->rhs_)._M_ptr;
  iVar4 = (*prVar1->_vptr_rt_expression_interface[0xe])(prVar1,e,repl);
  prVar5->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_001115f8;
  prVar5[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar2);
  prVar5[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_01,iVar3);
  prVar5[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_02,iVar4);
  return prVar5;
}

Assistant:

InterfaceType * substitute(const InterfaceType * e,
                                 const InterfaceType * repl) const
      {
        if (deep_equal(e))
          return repl->clone();

        return new rt_binary_expr(lhs_->substitute(e, repl),
                               op_->clone(),
                               rhs_->substitute(e, repl) );
      }